

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_cas2_16(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
    return;
  }
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar7 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 4;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar7 = pmmu_translate_addr(uVar7);
  }
  uVar1 = m68k_read_memory_32(uVar7 & m68ki_cpu.address_mask);
  uVar8 = uVar1 >> 0x10 & 7;
  uVar7 = m68ki_cpu.dar[uVar1 >> 0x1c];
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar2 = uVar7;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar2 = pmmu_translate_addr(uVar7);
  }
  uVar3 = m68k_read_memory_16(uVar2 & m68ki_cpu.address_mask);
  uVar9 = uVar3 - (ushort)m68ki_cpu.dar[uVar8];
  uVar6 = (ulong)(uVar1 & 7);
  uVar2 = *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar1 >> 10 & 0x3c));
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar4 = uVar2;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar4 = pmmu_translate_addr(uVar2);
  }
  uVar5 = m68k_read_memory_16(uVar4 & m68ki_cpu.address_mask);
  m68ki_cpu.c_flag = uVar9 >> 8;
  m68ki_cpu.not_z_flag = uVar9 & 0xffff;
  m68ki_cpu.v_flag = ((uVar9 ^ uVar3) & (m68ki_cpu.dar[uVar8] ^ uVar3)) >> 8;
  if ((uVar9 & 0xffff) == 0) {
    uVar9 = uVar5 - (m68ki_cpu.dar[uVar6] & 0xffff);
    m68ki_cpu.n_flag = uVar9 >> 8;
    m68ki_cpu.v_flag = ((uVar9 ^ uVar5) & (m68ki_cpu.dar[uVar6] ^ uVar5)) >> 8;
    m68ki_cpu.not_z_flag = uVar9 & 0xffff;
    m68ki_cpu.c_flag = m68ki_cpu.n_flag;
    if (m68ki_cpu.not_z_flag == 0) {
      m68ki_remaining_cycles = m68ki_remaining_cycles + -3;
      uVar8 = *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar1 >> 0x14 & 0x1c));
      my_fc_handler(m68ki_cpu.s_flag | 1);
      if (m68ki_cpu.pmmu_enabled != 0) {
        uVar7 = pmmu_translate_addr(uVar7);
      }
      m68k_write_memory_16(uVar7 & m68ki_cpu.address_mask,uVar8);
      uVar1 = *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar1 >> 4 & 0x1c));
      my_fc_handler(m68ki_cpu.s_flag | 1);
      if (m68ki_cpu.pmmu_enabled != 0) {
        uVar2 = pmmu_translate_addr(uVar2);
      }
      m68k_write_memory_16(uVar2 & m68ki_cpu.address_mask,uVar1);
      return;
    }
  }
  uVar9 = m68ki_cpu.dar[uVar8] & 0xffff0000 | uVar3;
  if ((int)uVar1 < 0) {
    uVar9 = (int)(short)uVar3;
  }
  m68ki_cpu.n_flag = m68ki_cpu.c_flag;
  m68ki_cpu.dar[uVar8] = uVar9;
  if ((short)uVar1 < 0) {
    uVar7 = (uint)(short)uVar5;
  }
  else {
    uVar7 = (uint)*(ushort *)((long)m68ki_cpu.dar + uVar6 * 4 + 2) << 0x10 | uVar5;
  }
  m68ki_cpu.dar[uVar6] = uVar7;
  return;
}

Assistant:

static void m68k_op_cas2_16(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_32();
		uint* compare1 = &REG_D[(word2 >> 16) & 7];
		uint ea1 = REG_DA[(word2 >> 28) & 15];
		uint dest1 = m68ki_read_16(ea1);
		uint res1 = dest1 - MASK_OUT_ABOVE_16(*compare1);
		uint* compare2 = &REG_D[word2 & 7];
		uint ea2 = REG_DA[(word2 >> 12) & 15];
		uint dest2 = m68ki_read_16(ea2);
		uint res2;

		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		FLAG_N = NFLAG_16(res1);
		FLAG_Z = MASK_OUT_ABOVE_16(res1);
		FLAG_V = VFLAG_SUB_16(*compare1, dest1, res1);
		FLAG_C = CFLAG_16(res1);

		if(COND_EQ())
		{
			res2 = dest2 - MASK_OUT_ABOVE_16(*compare2);

			FLAG_N = NFLAG_16(res2);
			FLAG_Z = MASK_OUT_ABOVE_16(res2);
			FLAG_V = VFLAG_SUB_16(*compare2, dest2, res2);
			FLAG_C = CFLAG_16(res2);

			if(COND_EQ())
			{
				USE_CYCLES(3);
				m68ki_write_16(ea1, REG_D[(word2 >> 22) & 7]);
				m68ki_write_16(ea2, REG_D[(word2 >> 6) & 7]);
				return;
			}
		}
        /*
        if (BIT_1F(word2)) {
            *compare1 = (uint)MAKE_INT_16(dest1);
        } else {
            *compare1 = MASK_OUT_BELOW_16(*compare1) | dest1;
        }
        if (BIT_F(word2)) {
            *compare2 = (uint)MAKE_INT_16(dest2);
        } else {
            *compare2 = MASK_OUT_BELOW_16(*compare2) | dest2;
        }
        */
        *compare1 = BIT_1F(word2) ? (uint)MAKE_INT_16(dest1) : MASK_OUT_BELOW_16(*compare1) | dest1;
		*compare2 = BIT_F(word2) ? (uint)MAKE_INT_16(dest2) : MASK_OUT_BELOW_16(*compare2) | dest2;
        return;
	}
	m68ki_exception_illegal();
}